

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O2

void __thiscall
iqxmlrpc::http::Request_header::Request_header
          (Request_header *this,string *req_uri,string *vhost,int port)

{
  ostream *poVar1;
  ostringstream host_opt;
  allocator<char> local_1e2;
  allocator<char> local_1e1;
  string local_1e0;
  string local_1c0;
  ostringstream local_1a0 [376];
  
  Header::Header(&this->super_Header,HTTP_CHECK_WEAK);
  (this->super_Header)._vptr_Header = (_func_int **)&PTR__Request_header_0019cb48;
  std::__cxx11::string::string((string *)&this->uri_,(string *)req_uri);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,(string *)vhost);
  poVar1 = std::operator<<(poVar1,":");
  std::ostream::operator<<(poVar1,port);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"host",&local_1e2);
  std::__cxx11::stringbuf::str();
  Header::set_option(&this->super_Header,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"user-agent",&local_1e2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"Libiqxmlrpc 0.13.6",&local_1e1);
  Header::set_option(&this->super_Header,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return;
}

Assistant:

Request_header::Request_header(
  const std::string& req_uri,
  const std::string& vhost,
  int port
):
  uri_(req_uri)
{
  std::ostringstream host_opt;
  host_opt << vhost << ":" << port;
  set_option(names::host, host_opt.str());
  set_option(names::user_agent, PACKAGE " " VERSION);
}